

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctf-2-json-val-req.cpp
# Opt level: O0

void __thiscall
yactfr::internal::JsonIntRangeSetValReqBase<yactfr::internal::JsonUIntValReq>::_validate
          (JsonIntRangeSetValReqBase<yactfr::internal::JsonUIntValReq> *this,JsonVal *jsonVal)

{
  TextParseError *exc;
  JsonVal *jsonVal_local;
  JsonIntRangeSetValReqBase<yactfr::internal::JsonUIntValReq> *this_local;
  
  JsonArrayValReq::_validate(&this->super_JsonArrayValReq,jsonVal);
  return;
}

Assistant:

void _validate(const JsonVal& jsonVal) const override
    {
        try {
            JsonArrayValReq::_validate(jsonVal);
        } catch (TextParseError& exc) {
            appendMsgToTextParseError(exc, "Invalid integer range set:", jsonVal.loc());
            throw;
        }
    }